

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphFileOperations.hpp
# Opt level: O0

string * floorplan::GraphFileOperations::formatStringForDot
                   (string *__return_storage_ptr__,string *str)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  undefined1 *puVar4;
  long local_78;
  size_t found;
  allocator<char> local_59;
  string local_58 [8];
  string illegalChars;
  string *str_local;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
    iVar1 = isdigit((int)*pcVar3);
    if (iVar1 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&illegalChars.field_2 + 8),"S",str);
      std::__cxx11::string::operator=
                ((string *)str,(string *)(illegalChars.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(illegalChars.field_2._M_local_buf + 8));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,"-* ",&local_59);
    std::allocator<char>::~allocator(&local_59);
    local_78 = std::__cxx11::string::find_first_of((string *)str,(ulong)local_58);
    while (local_78 != -1) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)str);
      *puVar4 = 0x5f;
      local_78 = std::__cxx11::string::find_first_of((string *)str,(ulong)local_58);
    }
    std::__cxx11::string::~string(local_58);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

static string formatStringForDot(string str){
        if (str.size() != 0){
            if (isdigit(str[0]))
                str = "S" + str;

            string illegalChars = "-* ";
            size_t found=str.find_first_of(illegalChars);
            while (found!=string::npos)
            {
                str[found]='_';
                found=str.find_first_of(illegalChars,found+1);
            }
        }
        return str;

    }